

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlwaysFFAssignmentOutsideConditional.cpp
# Opt level: O0

void __thiscall
always_ff_assignment_outside_conditional::MainVisitor::handle
          (AlwaysFFVisitor *this,VariableSymbol *symbol)

{
  string_view resetName;
  string_view name;
  string_view arg;
  bool bVar1;
  SourceLocation *pSVar2;
  _Storage<slang::SourceLocation,_true> _Var3;
  undefined1 uVar4;
  long in_RSI;
  long in_RDI;
  optional<slang::SourceLocation> oVar5;
  AlwaysFFVisitor visitor;
  ValueDriver *firstDriver;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *in_stack_fffffffffffffdb8;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *in_stack_fffffffffffffdc0;
  SourceLocation location;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffdd4;
  DiagCode code;
  undefined7 in_stack_fffffffffffffe11;
  SourceManager *in_stack_fffffffffffffe48;
  SourceLocation in_stack_fffffffffffffe50;
  ValueSymbol *in_stack_fffffffffffffea8;
  TidyVisitor *in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff48;
  
  slang::not_null<const_slang::SourceManager_*>::operator->
            ((not_null<const_slang::SourceManager_*> *)0x33e5a9);
  slang::SourceManager::getFileName(in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
  bVar1 = TidyVisitor::skip(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  if (!bVar1) {
    slang::ast::ValueSymbol::drivers(in_stack_fffffffffffffea8);
    bVar1 = std::ranges::
            subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
            ::empty((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                     *)0x33e626);
    std::ranges::
    subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
    ::~subrange(in_stack_fffffffffffffdc0);
    if (!bVar1) {
      slang::ast::ValueSymbol::drivers(in_stack_fffffffffffffea8);
      std::ranges::
      subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
      ::begin(in_stack_fffffffffffffdb8);
      pSVar2 = (SourceLocation *)
               slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::
               const_iterator::operator*
                         ((const_iterator *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      uVar6 = SUB84(pSVar2,0);
      code = SUB84((ulong)pSVar2 >> 0x20,0);
      location = *pSVar2;
      slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
      ~const_iterator((const_iterator *)0x33e6ca);
      std::ranges::
      subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
      ::~subrange(in_stack_fffffffffffffdc0);
      if ((location != (SourceLocation)0x0) &&
         (*(DriverSource *)((long)location + 0x1a) == AlwaysFF)) {
        TidyConfig::getCheckConfigs(*(TidyConfig **)(in_RDI + 0x10));
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc0);
        name._M_str._0_4_ = uVar6;
        name._M_len = (size_t)location;
        name._M_str._4_4_ = code;
        resetName._M_str = (char *)in_stack_fffffffffffffdc0;
        resetName._M_len = (size_t)in_stack_fffffffffffffdb8;
        AlwaysFFVisitor::AlwaysFFVisitor((AlwaysFFVisitor *)0x33e770,name,resetName);
        slang::not_null<const_slang::ast::Symbol_*>::operator->
                  ((not_null<const_slang::ast::Symbol_*> *)0x33e781);
        slang::ast::Symbol::visit<always_ff_assignment_outside_conditional::AlwaysFFVisitor&>
                  ((Symbol *)CONCAT44(code,uVar6),(AlwaysFFVisitor *)location);
        bVar1 = AlwaysFFVisitor::hasError((AlwaysFFVisitor *)&stack0xfffffffffffffe48);
        if (bVar1) {
          pSVar2 = *(SourceLocation **)(in_RDI + 8);
          oVar5 = AlwaysFFVisitor::getErrorLocation((AlwaysFFVisitor *)&stack0xfffffffffffffe48);
          _Var3 = oVar5.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::SourceLocation>._M_payload;
          uVar4 = oVar5.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::SourceLocation>._M_engaged;
          std::optional<slang::SourceLocation>::value_or<slang::SourceLocation_const&>
                    ((optional<slang::SourceLocation> *)location,pSVar2);
          slang::Diagnostics::add((Diagnostics *)pSVar2,code,location);
          arg._M_str._0_1_ = uVar4;
          arg._M_len = (size_t)_Var3;
          arg._M_str._1_7_ = in_stack_fffffffffffffe11;
          slang::Diagnostic::operator<<(*(Diagnostic **)(in_RSI + 0x10),arg);
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const VariableSymbol& symbol) {
        NEEDS_SKIP_SYMBOL(symbol)
        if (symbol.drivers().empty())
            return;

        auto firstDriver = *symbol.drivers().begin();
        if (firstDriver && firstDriver->source == DriverSource::AlwaysFF) {
            AlwaysFFVisitor visitor(symbol.name, config.getCheckConfigs().resetName);
            firstDriver->containingSymbol->visit(visitor);
            if (visitor.hasError()) {
                diags.add(diag::RegisterNotAssignedOnReset,
                          visitor.getErrorLocation().value_or(symbol.location))
                    << symbol.name;
            }
        }
    }